

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RandCaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandCaseStatement,std::span<slang::ast::RandCaseStatement::Item,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  pointer pIVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  RandCaseStatement *pRVar5;
  
  pRVar5 = (RandCaseStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RandCaseStatement *)this->endPtr < pRVar5 + 1) {
    pRVar5 = (RandCaseStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pRVar5 + 1);
  }
  pIVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  SVar3 = args_1->startLoc;
  SVar4 = args_1->endLoc;
  (pRVar5->super_Statement).kind = RandCase;
  (pRVar5->super_Statement).syntax = (StatementSyntax *)0x0;
  (pRVar5->super_Statement).sourceRange.startLoc = SVar3;
  (pRVar5->super_Statement).sourceRange.endLoc = SVar4;
  (pRVar5->items)._M_ptr = pIVar1;
  (pRVar5->items)._M_extent._M_extent_value = sVar2;
  return pRVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }